

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-timed.c
# Opt level: O0

parser_error parse_player_timed_name(parser *p)

{
  errr eVar1;
  int local_2c;
  char *pcStack_28;
  wchar_t index;
  char *name;
  timed_effect_parse_state *ps;
  parser *p_local;
  
  ps = (timed_effect_parse_state *)p;
  name = (char *)parser_priv(p);
  pcStack_28 = parser_getstr((parser *)ps,"name");
  eVar1 = grab_name("timed effect",pcStack_28,list_timed_effect_names,0x36,&local_2c);
  if (eVar1 == 0) {
    if (name == (char *)0x0) {
      __assert_fail("ps",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/player-timed.c"
                    ,0x6a,"enum parser_error parse_player_timed_name(struct parser *)");
    }
    *(timed_effect_data **)name = timed_effects + local_2c;
    name[8] = '\0';
    name[9] = '\0';
    name[10] = '\0';
    name[0xb] = '\0';
    name[0xc] = '\0';
    name[0xd] = '\0';
    name[0xe] = '\0';
    name[0xf] = '\0';
    p_local._4_4_ = PARSE_ERROR_NONE;
  }
  else {
    p_local._4_4_ = PARSE_ERROR_INVALID_SPELL_NAME;
  }
  return p_local._4_4_;
}

Assistant:

static enum parser_error parse_player_timed_name(struct parser *p)
{
	struct timed_effect_parse_state *ps =
		(struct timed_effect_parse_state*) parser_priv(p);
	const char *name = parser_getstr(p, "name");
	int index;

	if (grab_name("timed effect",
			name,
			list_timed_effect_names,
			N_ELEMENTS(list_timed_effect_names),
			&index)) {
		/* XXX not a desctiptive error */
		return PARSE_ERROR_INVALID_SPELL_NAME;
	}

	assert(ps);
	ps->t = &timed_effects[index];
	ps->e = NULL;

	return PARSE_ERROR_NONE;
}